

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O0

int G1_to_bin(uint8_t *s,G1 *P,ATE_CTX *ctx)

{
  G1 tmp;
  G1 *in_stack_ffffffffffffff88;
  G1 *in_stack_ffffffffffffff90;
  ATE_CTX *in_stack_ffffffffffffffa8;
  G1 *in_stack_ffffffffffffffb0;
  ATE_CTX *in_stack_ffffffffffffffd0;
  fp_struct_st *in_stack_ffffffffffffffd8;
  uint8_t *in_stack_ffffffffffffffe0;
  
  G1_copy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  G1_makeaffine(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  fp_to_bin(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  fp_to_bin(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return 1;
}

Assistant:

int G1_to_bin(uint8_t s[2*N_BYTES], const G1 *P, const ATE_CTX *ctx)
{
    G1 tmp;
    G1_copy(&tmp, P);
    G1_makeaffine(&tmp, ctx);
    fp_to_bin(s, tmp.m_x, ctx);
    fp_to_bin(s + N_BYTES, tmp.m_y, ctx);
    return GML_OK;
}